

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Count_Heap.h
# Opt level: O3

void __thiscall Count_Heap<4U>::Init(Count_Heap<4U> *this,Data<4U> *item)

{
  void *pvVar1;
  int iVar2;
  int **ppiVar3;
  uint uVar4;
  void *pvVar5;
  count_type counter;
  uint8_t *data;
  ulong uVar6;
  uint32_t k1;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Heap<4U> *this_00;
  
  uVar4 = this->hash_num;
  pvVar5 = operator_new__((ulong)uVar4 * 4);
  if ((ulong)uVar4 == 0) {
    this_00 = this->heap;
LAB_0010bd7c:
    uVar9 = 0;
  }
  else {
    ppiVar3 = this->counter;
    uVar6 = 0;
    do {
      uVar7 = ((uint)(*(int *)item->str * -0x3361d2af) >> 0x11 | *(int *)item->str * 0x16a88000) *
              0x1b873593;
      uVar4 = uVar7 ^ (uint)uVar6;
      uVar4 = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64;
      uVar4 = (uVar4 >> 0x10 ^ uVar4 ^ 4) * -0x7a143595;
      uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
      uVar9 = (ulong)(uVar4 >> 0x10 ^ uVar4) % (ulong)this->length;
      uVar7 = (uint)uVar6 + 0x65 ^ uVar7;
      uVar4 = (uVar7 >> 0x13 | uVar7 << 0xd) * 5 + 0xe6546b64;
      uVar4 = (uVar4 >> 0x10 ^ uVar4 ^ 4) * -0x7a143595;
      uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
      iVar2 = COUNT[(uVar4 >> 0x10 ^ uVar4) & 1];
      iVar8 = ppiVar3[uVar6][uVar9] + iVar2;
      ppiVar3[uVar6][uVar9] = iVar8;
      *(int *)((long)pvVar5 + uVar6 * 4) = iVar8 * iVar2;
      uVar6 = uVar6 + 1;
      uVar4 = this->hash_num;
      uVar9 = (ulong)uVar4;
    } while (uVar6 < uVar9);
    this_00 = this->heap;
    if (uVar4 == 0) goto LAB_0010bd7c;
    pvVar1 = (void *)((long)pvVar5 + uVar9 * 4);
    std::__introsort_loop<int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pvVar5,pvVar1,(int)LZCOUNT(uVar9) * 2 ^ 0x7e);
    std::__final_insertion_sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(pvVar5,pvVar1);
    if ((uVar4 & 1) != 0) {
      counter = *(count_type *)((long)pvVar5 + (ulong)(uVar4 >> 1) * 4);
      goto LAB_0010bd98;
    }
  }
  counter = (*(int *)((long)pvVar5 + (ulong)((int)(uVar9 >> 1) - 1) * 4) +
            *(int *)((long)pvVar5 + (uVar9 >> 1) * 4)) / 2;
LAB_0010bd98:
  Heap<4U>::Insert(this_00,item,counter);
  operator_delete__(pvVar5);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		int* result = new int[hash_num];

		for (uint32_t i = 0; i < hash_num; ++i) {
			uint32_t position = item.Hash(i) % length;
			uint32_t choice = item.Hash(i + 101) & 1;
			counter[i][position] += COUNT[choice];
			result[i] = counter[i][position] * COUNT[choice];
		}

		heap->Insert(item, Get_Median(result, hash_num));
		delete[] result;
	}